

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomChar::read(DomChar *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  long lVar2;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringView QVar3;
  QStringView QVar4;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QString local_60;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QXmlStreamReader::error();
  if (iVar1 == 0) {
    do {
      iVar1 = QXmlStreamReader::readNext();
      if (iVar1 == 4) {
        local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = (QStringView)QXmlStreamReader::name();
        QVar4.m_data = L"unicode";
        QVar4.m_size = 7;
        iVar1 = QtPrivate::compareStrings(local_48,QVar4,CaseInsensitive);
        if (iVar1 == 0) {
          QXmlStreamReader::readElementText
                    (&local_60,(QString *)CONCAT44(in_register_00000034,__fd),0);
          QVar3.m_data = local_60.d.ptr;
          QVar3.m_size = local_60.d.size;
          lVar2 = QString::toIntegral_helper(QVar3,(bool *)0x0,10);
          iVar1 = (int)lVar2;
          if (iVar1 != lVar2) {
            iVar1 = 0;
          }
          *(byte *)&this->m_children = (byte)this->m_children | 1;
          this->m_unicode = iVar1;
        }
        else {
          local_78.a.m_size = 0x13;
          local_78.a.m_data = "Unexpected element ";
          local_78.b = &local_48;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_60,&local_78);
          QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
        }
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else if (iVar1 == 5) break;
      iVar1 = QXmlStreamReader::error();
    } while (iVar1 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomChar::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"unicode"_s, Qt::CaseInsensitive)) {
                setElementUnicode(reader.readElementText().toInt());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}